

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int derive_secret(st_ptls_key_schedule_t *sched,void *secret,char *label)

{
  size_t outlen;
  ptls_iovec_t hash_value_00;
  int iVar1;
  ptls_iovec_t secret_00;
  uint8_t hash_value [64];
  
  (*sched->msghash->final)(sched->msghash,hash_value,PTLS_HASH_FINAL_MODE_SNAPSHOT);
  outlen = sched->algo->digest_size;
  hash_value_00.len = outlen;
  hash_value_00.base = hash_value;
  secret_00.len = outlen;
  secret_00.base = sched->secret;
  iVar1 = hkdf_expand_label(sched->algo,secret,outlen,secret_00,label,hash_value_00);
  (*ptls_clear_memory)(hash_value,sched->algo->digest_size * 2);
  return iVar1;
}

Assistant:

static int derive_secret(struct st_ptls_key_schedule_t *sched, void *secret, const char *label)
{
    uint8_t hash_value[PTLS_MAX_DIGEST_SIZE];

    sched->msghash->final(sched->msghash, hash_value, PTLS_HASH_FINAL_MODE_SNAPSHOT);

    int ret =
        hkdf_expand_label(sched->algo, secret, sched->algo->digest_size, ptls_iovec_init(sched->secret, sched->algo->digest_size),
                          label, ptls_iovec_init(hash_value, sched->algo->digest_size));

    ptls_clear_memory(hash_value, sched->algo->digest_size * 2);
    return ret;
}